

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateSetDictionary(zng_stream *strm,uint8_t *dictionary,uint32_t dictLength)

{
  ulong uVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 in_EDX;
  uint8_t *in_RSI;
  zng_stream *in_RDI;
  unsigned_long dictid;
  inflate_state *state;
  ulong in_stack_ffffffffffffffd0;
  internal_state *end;
  undefined4 in_stack_ffffffffffffffe0;
  int32_t local_4;
  
  iVar2 = inflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    end = in_RDI->state;
    if ((*(int *)&end->pending_out == 0) || (*(int *)&end->pending_buf == 0x3f3e)) {
      if (*(int *)&end->pending_buf == 0x3f3e) {
        uVar3 = (*functable.adler32)(1,in_RSI,(size_t)in_EDX);
        in_stack_ffffffffffffffd0 = (ulong)uVar3;
        uVar1._0_4_ = end->wrap;
        uVar1._4_4_ = end->gzindex;
        if (in_stack_ffffffffffffffd0 != uVar1) {
          return -3;
        }
      }
      updatewindow((zng_stream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),(uint8_t *)end,
                   (uint32_t)(in_stack_ffffffffffffffd0 >> 0x20),(int32_t)in_stack_ffffffffffffffd0)
      ;
      *(undefined4 *)((long)&end->pending_out + 4) = 1;
      local_4 = 0;
    }
    else {
      local_4 = -2;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateSetDictionary)(PREFIX3(stream) *strm, const uint8_t *dictionary, uint32_t dictLength) {
    struct inflate_state *state;
    unsigned long dictid;

    /* check state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if (state->wrap != 0 && state->mode != DICT)
        return Z_STREAM_ERROR;

    /* check for correct dictionary identifier */
    if (state->mode == DICT) {
        dictid = FUNCTABLE_CALL(adler32)(ADLER32_INITIAL_VALUE, dictionary, dictLength);
        if (dictid != state->check)
            return Z_DATA_ERROR;
    }

    INFLATE_SET_DICTIONARY_HOOK(strm, dictionary, dictLength);  /* hook for IBM Z DFLTCC */

    /* copy dictionary to window using updatewindow(), which will amend the
       existing dictionary if appropriate */
    updatewindow(strm, dictionary + dictLength, dictLength, 0);

    state->havedict = 1;
    Tracev((stderr, "inflate:   dictionary set\n"));
    return Z_OK;
}